

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_number.cpp
# Opt level: O2

void __thiscall number::neg_neg::test_method(neg_neg *this)

{
  JSONType JVar1;
  double result;
  undefined4 local_dc;
  undefined8 local_d8;
  undefined **local_d0;
  undefined1 local_c8;
  undefined7 uStack_c7;
  undefined8 *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  JSONParser json;
  
  std::__cxx11::string::string((string *)&local_d0,"-0.0321e-10",(allocator *)&result);
  json.p = (char *)local_d0;
  json.pe = (char *)((long)local_d0 + CONCAT71(uStack_c7,local_c8));
  json.skipOverErrors = false;
  json.eof = json.pe;
  std::__cxx11::string::~string((string *)&local_d0);
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/matiu2[P]yajp/tests/parser/test_number.cpp"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x6a);
  local_c8 = 0;
  local_d0 = &PTR__lazy_ostream_00112b78;
  local_c0 = &boost::unit_test::lazy_ostream::inst;
  local_b8 = "";
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/matiu2[P]yajp/tests/parser/test_number.cpp"
  ;
  local_78 = "";
  JVar1 = yajp::JSONParser::getNextType(&json,false);
  result = (double)CONCAT44(result._4_4_,JVar1);
  local_d8 = CONCAT44(local_d8._4_4_,0x30);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,yajp::JSONParser::JSONType,yajp::JSONParser::JSONType>
            (&local_d0,&local_80,0x6a,2,2,&result,"json.getNextType()",&local_d8,
             "yajp::JSONParser::number");
  result = yajp::JSONParser::readNumber<double>(&json);
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/matiu2[P]yajp/tests/parser/test_number.cpp"
  ;
  local_88 = "";
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_90,0x6c);
  local_c8 = 0;
  local_d0 = &PTR__lazy_ostream_00112b78;
  local_c0 = &boost::unit_test::lazy_ostream::inst;
  local_b8 = "";
  local_b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/matiu2[P]yajp/tests/parser/test_number.cpp"
  ;
  local_a8 = "";
  local_d8 = 0xbd8c3c4703d017ad;
  local_dc = 10;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<int>>
            (&local_d0,&local_b0,0x6c,1,8,&result,"result",&local_d8,"-0.00000000000321",&local_dc,
             "::boost::math::fpc::percent_tolerance(10)");
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( neg_neg ) {
    yajp::JSONParser json("-0.0321e-10");
    BOOST_REQUIRE_EQUAL(json.getNextType(), yajp::JSONParser::number);
    double result = json.readNumber();
    BOOST_CHECK_CLOSE(result, -0.00000000000321, 10);
}